

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-textblock.c
# Opt level: O0

void new_line(size_t **line_starts,size_t **line_lengths,size_t *n_lines,size_t *cur_line,
             size_t start,size_t len)

{
  size_t *psVar1;
  size_t len_local;
  size_t start_local;
  size_t *cur_line_local;
  size_t *n_lines_local;
  size_t **line_lengths_local;
  size_t **line_starts_local;
  
  if (*cur_line == *n_lines) {
    *n_lines = *n_lines + 0x18;
    psVar1 = (size_t *)mem_realloc(*line_starts,*n_lines << 3);
    *line_starts = psVar1;
    psVar1 = (size_t *)mem_realloc(*line_lengths,*n_lines << 3);
    *line_lengths = psVar1;
  }
  (*line_starts)[*cur_line] = start;
  (*line_lengths)[*cur_line] = len;
  *cur_line = *cur_line + 1;
  return;
}

Assistant:

static void new_line(size_t **line_starts, size_t **line_lengths,
		size_t *n_lines, size_t *cur_line,
		size_t start, size_t len)
{
	if (*cur_line == *n_lines) {
		/* this number is not arbitrary: it's the height of a "standard" term */
		(*n_lines) += 24;

		*line_starts = mem_realloc(*line_starts,
				*n_lines * sizeof **line_starts);
		*line_lengths = mem_realloc(*line_lengths,
				*n_lines * sizeof **line_lengths);
	}

	(*line_starts)[*cur_line] = start;
	(*line_lengths)[*cur_line] = len;

	(*cur_line)++;
}